

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O3

FlatView * generate_memory_topology(uc_struct_conflict15 *uc,MemoryRegion_conflict *mr)

{
  long *plVar1;
  FlatRange *pFVar2;
  ulong uVar3;
  long lVar4;
  AddrRange clip;
  Int128 IVar5;
  FlatView *view;
  AddressSpaceDispatch *d;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  Int128 *pIVar11;
  char *pcVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  MemoryRegionSection mrs;
  undefined8 in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  MemoryRegionSection local_78;
  
  view = (FlatView *)g_malloc0(0x28);
  view->ref = 1;
  view->root = (MemoryRegion *)mr;
  if (mr != (MemoryRegion_conflict *)0x0) {
    clip.size._0_8_ = in_stack_ffffffffffffff58;
    clip.start = (Int128)(ZEXT816(1) << 0x40);
    clip.size._8_8_ = in_stack_ffffffffffffff60;
    render_memory_region(view,mr,(Int128)ZEXT816(0),clip,false);
  }
  uVar15 = (ulong)view->nr;
  if (view->nr != 0) {
    uVar13 = 1;
    lVar14 = 0x70;
    uVar7 = 0;
    do {
      uVar8 = uVar7 + 1;
      pFVar2 = view->ranges;
      uVar10 = uVar8 & 0xffffffff;
      if (uVar8 < uVar15) {
        pIVar11 = &pFVar2[uVar7].addr.size;
        pcVar12 = (char *)((long)&pFVar2->mr + lVar14);
        uVar9 = uVar13;
        do {
          uVar3 = *(ulong *)(pcVar12 + -0x50);
          uVar10 = uVar9;
          if ((((*(long *)(pcVar12 + -0x58) + *(long *)(pcVar12 + -0x48) +
                 (ulong)CARRY8(*(ulong *)(pcVar12 + -0x60),uVar3) != *(long *)(pcVar12 + -0x18) ||
                 *(ulong *)(pcVar12 + -0x60) + uVar3 != *(long *)(pcVar12 + -0x20)) ||
               (*(long *)(pcVar12 + -0x70) != *(long *)(pcVar12 + -0x30))) ||
              (uVar3 + *(ulong *)(pcVar12 + -0x68) != *(long *)(pcVar12 + -0x28) ||
               *(long *)(pcVar12 + -0x48) + (ulong)CARRY8(uVar3,*(ulong *)(pcVar12 + -0x68)) != 0))
             || (pcVar12[-0x40] != *pcVar12)) break;
          uVar10 = *(ulong *)(pcVar12 + -0x10);
          lVar4 = *(long *)(pcVar12 + -8);
          IVar5 = *pIVar11;
          *(ulong *)pIVar11 = (long)*pIVar11 + uVar10;
          plVar1 = (long *)((long)&pFVar2[uVar7].addr.size + 8);
          *plVar1 = *plVar1 + lVar4 + (ulong)CARRY8((ulong)IVar5,uVar10);
          uVar9 = uVar9 + 1;
          pcVar12 = pcVar12 + 0x40;
          uVar10 = uVar15;
        } while (uVar9 < uVar15);
      }
      memmove(pFVar2 + uVar8,pFVar2 + (uVar10 & 0xffffffff),
              (ulong)(uint)((int)uVar15 - (int)uVar10) << 6);
      uVar6 = ((int)uVar8 - (int)uVar10) + view->nr;
      uVar15 = (ulong)uVar6;
      view->nr = uVar6;
      uVar13 = uVar13 + 1;
      lVar14 = lVar14 + 0x40;
      uVar7 = uVar8;
    } while (uVar8 < uVar15);
  }
  d = address_space_dispatch_new_tricore(uc,view);
  view->dispatch = d;
  if (view->nr != 0) {
    lVar14 = 0;
    uVar15 = 0;
    do {
      pFVar2 = view->ranges;
      local_78.size._0_8_ = *(undefined8 *)((long)&(pFVar2->addr).size + lVar14);
      local_78.size._8_8_ = *(undefined8 *)((long)&(pFVar2->addr).size + lVar14 + 8);
      local_78.mr = *(MemoryRegion **)((long)&pFVar2->mr + lVar14);
      local_78.offset_within_region = *(hwaddr *)((long)&pFVar2->offset_in_region + lVar14);
      local_78.fv = view;
      if (*(long *)((long)&(pFVar2->addr).start + lVar14 + 8) != 0) {
        __assert_fail("r == a",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/qemu/int128.h"
                      ,0x16,"uint64_t int128_get64(Int128)");
      }
      local_78.offset_within_address_space = *(hwaddr *)((long)&(pFVar2->addr).start + lVar14);
      local_78.readonly = (&pFVar2->readonly)[lVar14];
      flatview_add_to_dispatch_tricore(uc,view,&local_78);
      uVar15 = uVar15 + 1;
      lVar14 = lVar14 + 0x40;
    } while (uVar15 < view->nr);
    d = view->dispatch;
  }
  address_space_dispatch_compact_tricore(d);
  g_hash_table_replace(uc->flat_views,mr,view);
  return view;
}

Assistant:

static FlatView *generate_memory_topology(struct uc_struct *uc, MemoryRegion *mr)
{
    int i;
    FlatView *view;

    view = flatview_new(mr);

    if (mr) {
        render_memory_region(view, mr, int128_zero(),
                             addrrange_make(int128_zero(), int128_2_64()),
                             false);
    }
    flatview_simplify(view);

    view->dispatch = address_space_dispatch_new(uc, view);
    for (i = 0; i < view->nr; i++) {
        MemoryRegionSection mrs =
            section_from_flat_range(&view->ranges[i], view);
        flatview_add_to_dispatch(uc, view, &mrs);
    }
    address_space_dispatch_compact(view->dispatch);
    g_hash_table_replace(uc->flat_views, mr, view);

    return view;
}